

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ProgramOptions::run(ProgramOptions *this)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  shared_ptr<DataSet> ds;
  string local_498;
  KrazyMeans km;
  ofstream result_out;
  int aiStack_400 [120];
  ofstream points_out;
  int aiStack_200 [120];
  
  if (this->generate_benchmark == true) {
    generateBenchmark(this);
  }
  if (this->generate_example == true) {
    generateExample(this);
  }
  if ((this->input_file)._M_string_length != 0) {
    lVar1 = std::chrono::_V2::system_clock::now();
    DataSet::fromFile((DataSet *)&ds,&this->input_file);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Loading dataset           : ");
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
    poVar3 = std::operator<<(poVar3," s.");
    std::endl<char,std::char_traits<char>>(poVar3);
    KrazyMeans::KrazyMeans(&km,&ds,this->clusters,this->threshold_iters,this->scaling_factor);
    lVar1 = std::chrono::_V2::system_clock::now();
    KrazyMeans::initialize(&km);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Algorithm initialization  : ");
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
    poVar3 = std::operator<<(poVar3," s.");
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar1 = std::chrono::_V2::system_clock::now();
    KrazyMeans::run(&km,false);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Reached convergence after : ");
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
    pcVar4 = " s.";
    poVar3 = std::operator<<(poVar3," s.");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Iterations                : ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    if ((this->output_file)._M_string_length == 0) {
      pcVar4 = "No output file was specified.";
      poVar3 = (ostream *)&std::cerr;
    }
    else {
      lVar1 = std::chrono::_V2::system_clock::now();
      std::__cxx11::string::string((string *)&local_498,(string *)&this->output_file);
      KrazyMeans::dumpLabels(&km,&local_498);
      std::__cxx11::string::~string((string *)&local_498);
      lVar2 = std::chrono::_V2::system_clock::now();
      std::operator<<((ostream *)&std::cout,"Writing result            : ");
      poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    if (this->plot_outputs == true) {
      std::ofstream::ofstream(&points_out,"points.csv",_S_out);
      std::ofstream::ofstream(&result_out,"centroids.csv",_S_out);
      if ((*(int *)((long)aiStack_200 + *(long *)(_points_out + -0x18)) == 0) &&
         (*(int *)((long)aiStack_400 + *(long *)(_result_out + -0x18)) == 0)) {
        KrazyMeans::printState(&km,(ostream *)&points_out,(ostream *)&result_out);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Could not create CSV output files.");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      std::ofstream::~ofstream(&result_out);
      std::ofstream::~ofstream(&points_out);
    }
    KrazyMeans::~KrazyMeans(&km);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ds.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"No input file was specified.");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void run() {
    if (generate_benchmark) generateBenchmark();
    if (generate_example) generateExample();

    if (!input_file.empty()) {
      Timer t;

      // Load data
      t.start();
      auto ds = DataSet::fromFile(input_file);
      t.stop();
      std::cout << "Loading dataset           : " << t.seconds() << " s." << std::endl;

      // Create KM context
      auto km = KrazyMeans(ds, clusters, threshold_iters, scaling_factor);

      // Initialize algorithm
      t.start();
      km.initialize();
      t.stop();
      std::cout << "Algorithm initialization  : " << t.seconds() << " s." << std::endl;

      // Run algorithm
      t.start();
      km.run(false);
      t.stop();
      std::cout << "Reached convergence after : " << t.seconds() << " s." << std::endl;
      std::cout << "Iterations                : " << km.iteration << std::endl;

      // Write labels to file
      if (!output_file.empty()) {
        t.start();
        km.dumpLabels(output_file);
        t.stop();
        std::cout << "Writing result            : " << t.seconds() << " s." << std::endl;
      } else {
        std::cerr << "No output file was specified." << std::endl;
      }

      if (plot_outputs) {
        std::ofstream points_out("points.csv");
        std::ofstream result_out("centroids.csv");

        if (points_out.good() && result_out.good()) {
          km.printState(points_out, result_out);
        } else {
          std::cerr << "Could not create CSV output files." << std::endl;
        }
      }
    } else {
      std::cerr << "No input file was specified." << std::endl;
    }
  }